

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  int *piVar5;
  msghdr msgHdr;
  sockaddr_in6 sin;
  msghdr local_68;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  uint local_10;
  
  local_68.msg_name = (undefined8 *)0x0;
  local_68.msg_namelen = 0;
  local_68._12_4_ = 0;
  local_68.msg_control = (void *)0x0;
  local_68.msg_controllen = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  if (address != (ENetAddress *)0x0) {
    local_68.msg_name = &local_28;
    local_28 = (ulong)CONCAT22(address->port << 8 | address->port >> 8,10);
    uVar2 = *(undefined8 *)&(address->host).__in6_u;
    uVar3 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
    uStack_20 = (undefined4)uVar2;
    uStack_1c = (undefined4)((ulong)uVar2 >> 0x20);
    uStack_18 = (undefined4)uVar3;
    uStack_14 = (undefined4)((ulong)uVar3 >> 0x20);
    local_10 = (uint)address->sin6_scope_id;
    local_68.msg_namelen = 0x1c;
    local_68._12_4_ = 0;
  }
  local_68.msg_iov = (iovec *)buffers;
  local_68.msg_iovlen = bufferCount;
  sVar4 = sendmsg(socket,&local_68,0x4000);
  if ((int)sVar4 != -1) {
    return (int)sVar4;
  }
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  if (iVar1 != 0x5a) {
    if (iVar1 == 0xb) {
      return 0;
    }
    if (iVar1 != 4) {
      return -1;
    }
  }
  return -2;
}

Assistant:

int enet_socket_send(ENetSocket socket, const ENetAddress *address, const ENetBuffer *buffers, size_t bufferCount) {
        struct msghdr msgHdr;
        struct sockaddr_in6 sin;
        int sentLength;

        memset(&msgHdr, 0, sizeof(struct msghdr));

        if (address != NULL) {
            memset(&sin, 0, sizeof(struct sockaddr_in6));

            sin.sin6_family     = AF_INET6;
            sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
            sin.sin6_addr       = address->host;
            sin.sin6_scope_id   = address->sin6_scope_id;

            msgHdr.msg_name    = &sin;
            msgHdr.msg_namelen = sizeof(struct sockaddr_in6);
        }

        msgHdr.msg_iov    = (struct iovec *) buffers;
        msgHdr.msg_iovlen = bufferCount;

        sentLength = sendmsg(socket, &msgHdr, MSG_NOSIGNAL);

        if (sentLength == -1) {
            switch (errno)
            {
                case EWOULDBLOCK:
                    return 0;
                case EINTR:
                case EMSGSIZE:
                    return -2;
                default:
                    return -1;
            }

            return -1;
        }

        return sentLength;
    }